

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSAParameters.cpp
# Opt level: O2

ByteString * __thiscall
RSAParameters::serialise(ByteString *__return_storage_ptr__,RSAParameters *this)

{
  ByteString len;
  ByteString BStack_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::ByteString(&local_38,this->bitLen);
  ByteString::serialise(&local_60,&this->e);
  ByteString::serialise(&BStack_88,&local_38);
  operator+(__return_storage_ptr__,&local_60,&BStack_88);
  ByteString::~ByteString(&BStack_88);
  ByteString::~ByteString(&local_60);
  ByteString::~ByteString(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteString RSAParameters::serialise() const
{
	ByteString len(bitLen);

	return e.serialise() + len.serialise();
}